

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

void __thiscall
JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          JPPV_sharedPtr *jpolJPPV,Index ts,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  Index aohI;
  value_type pJVar2;
  sp_counted_base *psVar3;
  _func_int *p_Var4;
  element_type *peVar5;
  undefined8 uVar6;
  int iVar7;
  BayesianGameForDecPOMDPStage *pBVar8;
  element_type *this_00;
  PlanningUnitDecPOMDPDiscrete *pPVar9;
  int iVar10;
  Index IVar11;
  uint uVar12;
  const_reference ppJVar13;
  const_reference pvVar14;
  undefined4 extraout_var;
  size_t sVar15;
  TypeCluster *pTVar16;
  long lVar17;
  _Base_ptr p_Var18;
  E *this_01;
  undefined4 in_register_0000000c;
  ulong uVar19;
  ulong uVar20;
  Index *oIs;
  _Self _Var21;
  Index *aIs;
  Index agI;
  ulong uVar22;
  undefined1 auStack_108 [8];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  _Base_ptr local_e8;
  _Self __tmp;
  undefined1 auStack_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> observations;
  JPPV_sharedPtr local_78;
  element_type *local_68;
  shared_count sStack_60;
  JPPV_sharedPtr *local_58;
  ulong local_50;
  undefined8 local_48;
  PlanningUnitDecPOMDPDiscrete *local_40;
  allocator_type local_35;
  uint local_34;
  
  local_48 = CONCAT44(in_register_0000000c,ts);
  _Var21._M_node = (_Base_ptr)auStack_108;
  uVar19 = (ulong)ts;
  local_58 = jpolJPPV;
  local_40 = pu;
  ppJVar13 = std::
             vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
             ::at(jpolBGVec,uVar19);
  pJVar2 = *ppJVar13;
  pvVar14 = std::
            vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            ::at(bgVec,uVar19);
  local_68 = pvVar14->px;
  sStack_60.pi_ = (pvVar14->pn).pi_;
  psVar3 = (pvVar14->pn).pi_;
  if (psVar3 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar3->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  uVar22 = 0;
  iVar7 = (int)local_48;
  local_50 = (ulong)(iVar7 + 1);
  uVar19 = uVar19 * 4 + 0xf & 0xfffffffffffffff0;
  do {
    p_Var4 = (local_40->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6];
    *(undefined8 *)((long)_Var21._M_node + -8) = 0x3fba58;
    iVar10 = (*p_Var4)();
    if (CONCAT44(extraout_var,iVar10) <= uVar22) {
      *(undefined8 *)((long)_Var21._M_node + -8) = 0x3fbc85;
      boost::detail::shared_count::~shared_count(&sStack_60);
      return;
    }
    local_34 = 0;
    while( true ) {
      pBVar8 = &local_68->super_BayesianGameForDecPOMDPStage;
      agI = (Index)uVar22;
      *(undefined8 *)((long)_Var21._M_node + -8) = 0x3fba7b;
      sVar15 = BayesianGameBase::GetNrTypes
                         ((BayesianGameBase *)&pBVar8->super_BayesianGameIdenticalPayoff,agI);
      uVar12 = local_34;
      this_00 = local_68;
      if (sVar15 <= local_34) break;
      *(undefined8 *)((long)_Var21._M_node + -8) = 0x3fba95;
      pTVar16 = BayesianGameWithClusterInfo::GetTypeCluster(this_00,agI,uVar12);
      p_Var18 = (pTVar16->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var18 != &(pTVar16->_m_types)._M_t._M_impl.super__Rb_tree_header)
      {
        lVar17 = *(long *)(p_Var18 + 1);
        if (*(int *)(lVar17 + 8) != 1) {
          _Var21._M_node[-1]._M_right = (_Base_ptr)0x28;
          uVar6 = _Var21._M_node[-1]._M_right;
          _Var21._M_node[-1]._M_right = (_Base_ptr)0x3fbc9c;
          this_01 = (E *)__cxa_allocate_exception(uVar6);
          _Var21._M_node[-1]._M_right = (_Base_ptr)0x3fbcae;
          E::E(this_01,
               "JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent - expected an AOHINDEX type"
              );
          _Var21._M_node[-1]._M_right = (_Base_ptr)&LAB_003fbcc4;
          __cxa_throw(this_01,&E::typeinfo,E::~E);
        }
        local_e8 = p_Var18;
        _Var21._M_node[-1]._M_right = (_Base_ptr)0x3fbae2;
        lVar17 = __dynamic_cast(lVar17,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
        pPVar9 = local_40;
        aohI = *(Index *)(lVar17 + 0xc);
        aIs = (Index *)((long)_Var21._M_node - uVar19);
        oIs = (Index *)((long)aIs - uVar19);
        IVar11 = (Index)local_48;
        __tmp._M_node = _Var21._M_node;
        oIs[-2] = 0x3fbb22;
        oIs[-1] = 0;
        PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
                  (&pPVar9->super_PlanningUnitMADPDiscrete,agI,aohI,IVar11,aIs,oIs);
        observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_98 = (undefined1  [8])0x0;
        observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (IVar11 != 0) {
          oIs[-2] = 0x3fbb5e;
          oIs[-1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_100,(ulong)*oIs,
                     oIs + (iVar7 - 1),&local_35);
          oIs[-2] = 0x3fbb6d;
          oIs[-1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,&local_100);
          oIs[-2] = 0x3fbb75;
          oIs[-1] = 0;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_100);
          IVar11 = (Index)local_48;
        }
        pPVar9 = local_40;
        oIs[-2] = 0x3fbb8c;
        oIs[-1] = 0;
        IVar11 = PlanningUnitMADPDiscrete::GetObservationHistoryIndex
                           (&pPVar9->super_PlanningUnitMADPDiscrete,agI,IVar11,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
        uVar20 = (ulong)local_34;
        p_Var4 = (pJVar2->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13];
        oIs[-2] = 0x3fbba5;
        oIs[-1] = 0;
        uVar12 = (*p_Var4)(pJVar2,uVar22,uVar20);
        peVar5 = local_58->px;
        p_Var4 = (peVar5->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy
                 ._vptr_JointPolicy[0x10];
        oIs[-2] = 0x3fbbbf;
        oIs[-1] = 0;
        (*p_Var4)(peVar5,uVar22,(ulong)IVar11,(ulong)uVar12);
        pPVar9 = local_40;
        uVar20 = local_50;
        if (local_50 < (local_40->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon) {
          psVar3 = (local_58->pn).pi_;
          local_78.px = local_58->px;
          local_78.pn.pi_ = (local_58->pn).pi_;
          if (psVar3 != (sp_counted_base *)0x0) {
            LOCK();
            piVar1 = &psVar3->use_count_;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          oIs[-6] = uVar12;
          oIs[-0xc] = IVar11;
          *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            **)(oIs + -4) = jpolBGVec;
          *(TypeCluster **)(oIs + -10) = pTVar16;
          *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            **)(oIs + -2) = bgVec;
          oIs[-0xe] = 0x3fbc35;
          oIs[-0xd] = 0;
          RecursivelyFillPolicyForAgent
                    (this,pPVar9,&local_78,agI,(Index)uVar20,aohI,oIs[-0xc],
                     *(TypeCluster **)(oIs + -10),oIs[-8],oIs[-6],
                     *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                       **)(oIs + -4),
                     *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                       **)(oIs + -2));
          oIs[-2] = 0x3fbc42;
          oIs[-1] = 0;
          boost::detail::shared_count::~shared_count(&local_78.pn);
        }
        p_Var18 = local_e8;
        oIs[-2] = 0x3fbc4e;
        oIs[-1] = 0;
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        oIs[-2] = 0x3fbc5d;
        oIs[-1] = 0;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
        _Var21 = __tmp;
      }
      local_34 = local_34 + 1;
    }
    uVar22 = (ulong)(agI + 1);
  } while( true );
}

Assistant:

void 
JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent( 
        const PlanningUnitDecPOMDPDiscrete* pu,
        JPPV_sharedPtr jpolJPPV,
        Index ts,
        const vector<const JointPolicyDiscretePure*> & jpolBGVec,
        const vector<boost::shared_ptr<const BayesianGameWithClusterInfo> >& bgVec
        ) const 
{
    const JointPolicyDiscretePure* jpolBG = jpolBGVec.at(ts);
#if DEBUG_TOJPPV
    cout << ">>>StartRecursiveConstructionPerAgent jpolBG is "
         << jpolBG->SoftPrint() << endl;
#endif
    BGwCI_constPtr bg = bgVec.at(ts);
    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        for(Index tI=0; tI < bg->GetNrTypes(agI); tI++)
        {
            const TypeCluster* tc =  bg->GetTypeCluster(agI, tI);
            TypeCluster::type_ci it = tc->begin();
            TypeCluster::type_ci last = tc->end();
            while(it != last)
            {
                Type* t1 = *it;
                if(t1->GetSubClass() != Type::AOHINDEX)
                    throw E("JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent - expected an AOHINDEX type");
                Type_AOHIndex* t2 = dynamic_cast<Type_AOHIndex*>(t1);
                Index aohI = t2->GetAOHIndex();
                Index aIs[ts];
                Index oIs[ts];
                pu->GetActionObservationHistoryArrays (
                        agI, aohI, ts, aIs, oIs );
                vector<Index> observations;
                if(ts > 0)
                    observations = vector<Index>(oIs[0], oIs[ts-1]);
                Index ohI = pu->GetObservationHistoryIndex ( 
                        agI, ts, observations);
                Index aI = jpolBG->GetActionIndex(agI, tI);
                jpolJPPV->SetAction(agI, ohI, aI);
                
                if(ts+1 < pu->GetHorizon())
                    RecursivelyFillPolicyForAgent(
                        pu, jpolJPPV, agI, ts+1, aohI, ohI, tc, tI, aI, jpolBGVec, bgVec);
                it++;
            }
            
        }
    }

}